

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

int fmt::v6::detail::format_float<long_double>
              (longdouble value,int precision,float_specs specs,buffer<char> *buf)

{
  bool bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  char cVar10;
  undefined1 auVar11 [16];
  int iVar12;
  type tVar13;
  result rVar14;
  ulong uVar15;
  byte bVar16;
  ulong uVar17;
  long lVar18;
  buffer<char> *this;
  uint uVar19;
  long lVar20;
  uint64_t uVar21;
  ulong uVar22;
  ulong uVar23;
  uint64_t uVar24;
  ulong uVar25;
  boundaries bVar26;
  fp fVar27;
  fp fVar28;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 uVar29;
  undefined4 in_stack_ffffffffffffff5c;
  undefined4 uVar30;
  undefined2 in_stack_ffffffffffffff60;
  undefined2 uVar31;
  undefined6 in_stack_ffffffffffffff62;
  int exp;
  int cached_exp10;
  uint64_t local_88;
  buffer<char> *local_80;
  fp local_78;
  fixed_handler handler;
  
  if (value < (longdouble)0) {
    assert_fail((char *)CONCAT62(in_stack_ffffffffffffff62,in_stack_ffffffffffffff60),0,
                (char *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  }
  uVar23 = (ulong)specs & 0xff00000000;
  if (value <= (longdouble)0) {
    if (0 < precision && uVar23 == 0x200000000) {
      tVar13 = to_unsigned<int>(precision);
      buffer<char>::resize(buf,(ulong)tVar13);
      memset(buf->ptr_,0x30,(ulong)(uint)precision);
      return -precision;
    }
    handler.buf = (char *)CONCAT71(handler.buf._1_7_,0x30);
    buffer<char>::push_back(buf,(char *)&handler);
    return 0;
  }
  uVar31 = (undefined2)((unkuint10)value >> 0x40);
  uVar29 = SUB104(value,0);
  uVar30 = (undefined4)((unkuint10)value >> 0x20);
  if ((specs._4_4_ >> 0x13 & 1) == 0) {
    iVar12 = snprintf_float<long_double>(value,precision,specs,buf);
    return iVar12;
  }
  exp = 0;
  cached_exp10 = 0;
  local_88 = 1;
  if (precision < 0) {
    local_78.f = 0;
    local_78.e = 0;
    if ((specs._4_4_ >> 0x12 & 1) == 0) {
      local_80 = buf;
      bVar26 = fp::assign_with_boundaries<long_double>(&local_78,value);
      in_stack_ffffffffffffff58 = uVar29;
      in_stack_ffffffffffffff5c = uVar30;
      in_stack_ffffffffffffff60 = uVar31;
    }
    else {
      local_80 = buf;
      bVar26 = fp::assign_float_with_boundaries<long_double>(&local_78,value);
      in_stack_ffffffffffffff58 = uVar29;
      in_stack_ffffffffffffff5c = uVar30;
      in_stack_ffffffffffffff60 = uVar31;
    }
    fVar27._8_8_ = bVar26.upper;
    fVar27.f = (ulong)(uint)local_78.e;
    fVar28 = normalize<0>((detail *)local_78.f,fVar27);
    local_78.f = fVar28.f;
    local_78.e = fVar28.e;
    fVar28 = get_cached_power(-0x7c - local_78.e,&cached_exp10);
    uVar23 = fVar28.f;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar23;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = local_78.f;
    local_78.f = SUB168(auVar3 * auVar7,8) - (SUB168(auVar3 * auVar7,0) >> 0x3f);
    iVar12 = fVar28.e + local_78.e + 0x40;
    if (0x1c < fVar28.e + local_78.e + 0x7cU) {
      local_78.e = iVar12;
      __assert_fail("min_exp <= fp_value.e && fp_value.e <= -32",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/ZhiruiLi[P]GErr/thirdparty/fmt/include/fmt/format-inl.h"
                    ,0x43d,
                    "int fmt::detail::format_float(T, int, float_specs, buffer<char> &) [T = long double]"
                   );
    }
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar23;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = fVar27._8_8_;
    lVar18 = SUB168(auVar4 * auVar8,8);
    lVar20 = -(SUB168(auVar4 * auVar8,0) >> 0x3f);
    uVar22 = lVar18 + lVar20 + 1;
    bVar16 = -(char)iVar12;
    uVar21 = 1L << (bVar16 & 0x3f);
    uVar25 = uVar22 >> (bVar16 & 0x3f);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar23;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = bVar26.lower;
    handler.buf = local_80->ptr_;
    handler._16_8_ = uVar22 - local_78.f;
    handler.size = 0;
    local_78.e = iVar12;
    if ((uint32_t)uVar25 == 0) {
LAB_00106b34:
      handler.size = 0;
      assert_fail((char *)CONCAT62(in_stack_ffffffffffffff62,in_stack_ffffffffffffff60),0,
                  (char *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    }
    uVar24 = ((SUB168(auVar5 * auVar9,0) >> 0x3f) - SUB168(auVar5 * auVar9,8)) + lVar18 + lVar20 + 2
    ;
    uVar23 = uVar21 - 1;
    uVar22 = uVar22 & uVar23;
    local_88 = uVar21;
    exp = grisu_count_digits((uint32_t)uVar25);
    do {
      uVar19 = exp - 1;
      switch((ulong)uVar19) {
      case 0:
        cVar10 = (char)uVar25;
        uVar25 = 0;
        goto LAB_001069c1;
      case 1:
        uVar15 = 10;
        break;
      case 2:
        uVar15 = 100;
        break;
      case 3:
        uVar15 = 1000;
        break;
      case 4:
        uVar15 = 10000;
        break;
      case 5:
        uVar15 = 100000;
        break;
      case 6:
        uVar15 = 1000000;
        break;
      case 7:
        uVar15 = 10000000;
        break;
      case 8:
        uVar15 = 100000000;
        break;
      case 9:
        uVar15 = 1000000000;
        break;
      default:
        goto switchD_001066f7_default;
      }
      cVar10 = (char)((uVar25 & 0xffffffff) / uVar15);
      uVar25 = (uVar25 & 0xffffffff) % uVar15;
LAB_001069c1:
      in_stack_ffffffffffffff58 = 1;
      exp = uVar19;
      rVar14 = grisu_shortest_handler::on_digit
                         ((grisu_shortest_handler *)&handler,cVar10 + '0',
                          *(long *)(basic_data<void>::powers_of_10_64 + (ulong)uVar19 * 8) <<
                          (bVar16 & 0x3f),(uVar25 << (bVar16 & 0x3f)) + uVar22,uVar24,uVar19,true);
      uVar21 = local_88;
      if (rVar14 != more) goto LAB_00106a5a;
    } while (0 < exp);
    do {
      uVar25 = uVar22 * 10;
      uVar24 = uVar24 * 10;
      uVar22 = uVar25 & uVar23;
      exp = exp + -1;
      rVar14 = grisu_shortest_handler::on_digit
                         ((grisu_shortest_handler *)&handler,(char)(uVar25 >> (bVar16 & 0x3f)) + '0'
                          ,uVar21,uVar22,uVar24,exp,false);
    } while (rVar14 == more);
LAB_00106a5a:
    this = local_80;
    if (rVar14 == error) {
      exp = exp + handler.size + ~cached_exp10;
      fallback_format<long_double>(value,local_80,&exp);
      return exp;
    }
    uVar19 = to_unsigned<int>(handler.size);
LAB_00106ae2:
    buffer<char>::resize(this,(ulong)uVar19);
    iVar12 = exp - cached_exp10;
  }
  else {
    if ((uint)precision < 0x12) {
      auVar11._8_8_ = 0;
      auVar11._0_8_ = buf;
      fVar27 = normalize<0>((detail *)0x0,(fp)(auVar11 << 0x40));
      local_80 = buf;
      fVar28 = get_cached_power(-0x7c - fVar27.e,&cached_exp10);
      auVar2._8_8_ = 0;
      auVar2._0_8_ = fVar28.f;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = fVar27.f;
      uVar22 = SUB168(auVar2 * auVar6,8) - (SUB168(auVar2 * auVar6,0) >> 0x3f);
      cVar10 = (char)fVar28.e + (char)fVar27.e;
      handler.buf = local_80->ptr_;
      handler.size = 0;
      bVar16 = -cVar10;
      local_88 = local_88 << (bVar16 & 0x3f);
      handler.fixed = uVar23 == 0x200000000;
      handler.exp10 = -cached_exp10;
      uVar25 = uVar22 >> (bVar16 & 0x3f);
      handler.precision = precision;
      if ((uint32_t)uVar25 == 0) goto LAB_00106b34;
      if (uVar25 >> 0x20 != 0) {
        assert_fail((char *)CONCAT62(in_stack_ffffffffffffff62,in_stack_ffffffffffffff60),0,
                    (char *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      }
      bVar16 = -cVar10 - 0x40;
      exp = grisu_count_digits((uint32_t)uVar25);
      rVar14 = fixed_handler::on_start
                         (&handler,*(long *)(
                                            "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                                            + (long)exp * 8 + 0x18) << (bVar16 & 0x3f),uVar22 / 10,
                          10,&exp);
      if (rVar14 == more) {
        uVar15 = local_88 - 1;
        uVar22 = uVar22 & uVar15;
        uVar21 = 1;
        do {
          uVar19 = exp - 1;
          switch((ulong)uVar19) {
          case 0:
            cVar10 = (char)uVar25;
            uVar25 = 0;
            goto LAB_0010676b;
          case 1:
            uVar17 = 10;
            break;
          case 2:
            uVar17 = 100;
            break;
          case 3:
            uVar17 = 1000;
            break;
          case 4:
            uVar17 = 10000;
            break;
          case 5:
            uVar17 = 100000;
            break;
          case 6:
            uVar17 = 1000000;
            break;
          case 7:
            uVar17 = 10000000;
            break;
          case 8:
            uVar17 = 100000000;
            break;
          case 9:
            uVar17 = 1000000000;
            break;
          default:
switchD_001066f7_default:
            assert_fail((char *)CONCAT62(in_stack_ffffffffffffff62,in_stack_ffffffffffffff60),0,
                        (char *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
          }
          cVar10 = (char)((uVar25 & 0xffffffff) / uVar17);
          uVar25 = (uVar25 & 0xffffffff) % uVar17;
LAB_0010676b:
          in_stack_ffffffffffffff58 = 1;
          exp = uVar19;
          rVar14 = fixed_handler::on_digit
                             (&handler,cVar10 + '0',
                              *(long *)(basic_data<void>::powers_of_10_64 + (ulong)uVar19 * 8) <<
                              (bVar16 & 0x3f),(uVar25 << (bVar16 & 0x3f)) + uVar22,1,uVar19,true);
          uVar24 = local_88;
          if (rVar14 != more) goto LAB_00106806;
        } while (0 < exp);
        do {
          uVar25 = uVar22 * 10;
          uVar21 = uVar21 * 10;
          uVar22 = uVar25 & uVar15;
          exp = exp + -1;
          rVar14 = fixed_handler::on_digit
                             (&handler,(char)(uVar25 >> (bVar16 & 0x3f)) + '0',uVar24,uVar22,uVar21,
                              exp,false);
        } while (rVar14 == more);
      }
LAB_00106806:
      this = local_80;
      buf = local_80;
      if (rVar14 != error) {
        uVar25 = (ulong)(uint)handler.size;
        if (0 < handler.size && uVar23 != 0x200000000) {
          uVar25 = (ulong)(uint)handler.size;
          do {
            iVar12 = exp + 1;
            if (local_80->ptr_[uVar25 - 1] != '0') goto LAB_00106ad8;
            bVar1 = 1 < uVar25;
            uVar25 = uVar25 - 1;
            exp = iVar12;
          } while (bVar1);
          uVar25 = 0;
        }
LAB_00106ad8:
        uVar19 = to_unsigned<int>((int)uVar25);
        goto LAB_00106ae2;
      }
    }
    iVar12 = snprintf_float<long_double>(value,precision,specs,buf);
  }
  return iVar12;
}

Assistant:

int format_float(T value, int precision, float_specs specs, buffer<char>& buf) {
  static_assert(!std::is_same<T, float>::value, "");
  FMT_ASSERT(value >= 0, "value is negative");

  const bool fixed = specs.format == float_format::fixed;
  if (value <= 0) {  // <= instead of == to silence a warning.
    if (precision <= 0 || !fixed) {
      buf.push_back('0');
      return 0;
    }
    buf.resize(to_unsigned(precision));
    std::uninitialized_fill_n(buf.data(), precision, '0');
    return -precision;
  }

  if (!specs.use_grisu) return snprintf_float(value, precision, specs, buf);

  int exp = 0;
  const int min_exp = -60;  // alpha in Grisu.
  int cached_exp10 = 0;     // K in Grisu.
  if (precision < 0) {
    fp fp_value;
    auto boundaries = specs.binary32
                          ? fp_value.assign_float_with_boundaries(value)
                          : fp_value.assign_with_boundaries(value);
    fp_value = normalize(fp_value);
    // Find a cached power of 10 such that multiplying value by it will bring
    // the exponent in the range [min_exp, -32].
    const fp cached_pow = get_cached_power(
        min_exp - (fp_value.e + fp::significand_size), cached_exp10);
    // Multiply value and boundaries by the cached power of 10.
    fp_value = fp_value * cached_pow;
    boundaries.lower = multiply(boundaries.lower, cached_pow.f);
    boundaries.upper = multiply(boundaries.upper, cached_pow.f);
    assert(min_exp <= fp_value.e && fp_value.e <= -32);
    --boundaries.lower;  // \tilde{M}^- - 1 ulp -> M^-_{\downarrow}.
    ++boundaries.upper;  // \tilde{M}^+ + 1 ulp -> M^+_{\uparrow}.
    // Numbers outside of (lower, upper) definitely do not round to value.
    grisu_shortest_handler handler{buf.data(), 0,
                                   boundaries.upper - fp_value.f};
    auto result =
        grisu_gen_digits(fp(boundaries.upper, fp_value.e),
                         boundaries.upper - boundaries.lower, exp, handler);
    if (result == digits::error) {
      exp += handler.size - cached_exp10 - 1;
      fallback_format(value, buf, exp);
      return exp;
    }
    buf.resize(to_unsigned(handler.size));
  } else {
    if (precision > 17) return snprintf_float(value, precision, specs, buf);
    fp normalized = normalize(fp(value));
    const auto cached_pow = get_cached_power(
        min_exp - (normalized.e + fp::significand_size), cached_exp10);
    normalized = normalized * cached_pow;
    fixed_handler handler{buf.data(), 0, precision, -cached_exp10, fixed};
    if (grisu_gen_digits(normalized, 1, exp, handler) == digits::error)
      return snprintf_float(value, precision, specs, buf);
    int num_digits = handler.size;
    if (!fixed) {
      // Remove trailing zeros.
      while (num_digits > 0 && buf[num_digits - 1] == '0') {
        --num_digits;
        ++exp;
      }
    }
    buf.resize(to_unsigned(num_digits));
  }
  return exp - cached_exp10;
}